

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_signature_algorithm
              (mbedtls_ssl_context *ssl,uchar **p,uchar *end,mbedtls_md_type_t *md_alg,
              mbedtls_pk_type_t *pk_alg)

{
  mbedtls_md_type_t mVar1;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  mbedtls_pk_type_t *pk_alg_local;
  mbedtls_md_type_t *md_alg_local;
  uchar *end_local;
  uchar **p_local;
  mbedtls_ssl_context *ssl_local;
  
  *md_alg = MBEDTLS_MD_NONE;
  *pk_alg = MBEDTLS_PK_NONE;
  if (ssl->minor_ver == 3) {
    if (end < *p + 2) {
      ssl_local._4_4_ = -0x7b00;
    }
    else {
      mVar1 = mbedtls_ssl_md_alg_from_hash(**p);
      *md_alg = mVar1;
      if (mVar1 == MBEDTLS_MD_NONE) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x7a0,"Server used unsupported HashAlgorithm %d",(ulong)**p);
        ssl_local._4_4_ = -0x7b00;
      }
      else {
        mVar2 = mbedtls_ssl_pk_alg_from_sig((*p)[1]);
        *pk_alg = mVar2;
        if (mVar2 == MBEDTLS_PK_NONE) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7aa,"server used unsupported SignatureAlgorithm %d",(ulong)(*p)[1]);
          ssl_local._4_4_ = -0x7b00;
        }
        else {
          iVar3 = mbedtls_ssl_check_sig_hash(ssl,*md_alg);
          if (iVar3 == 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7b8,"Server used SignatureAlgorithm %d",(ulong)(*p)[1]);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7b9,"Server used HashAlgorithm %d",(ulong)**p);
            *p = *p + 2;
            ssl_local._4_4_ = 0;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x7b4,"server used HashAlgorithm that was not offered");
            ssl_local._4_4_ = -0x7b00;
          }
        }
      }
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_signature_algorithm( mbedtls_ssl_context *ssl,
                                          unsigned char **p,
                                          unsigned char *end,
                                          mbedtls_md_type_t *md_alg,
                                          mbedtls_pk_type_t *pk_alg )
{
    ((void) ssl);
    *md_alg = MBEDTLS_MD_NONE;
    *pk_alg = MBEDTLS_PK_NONE;

    /* Only in TLS 1.2 */
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        return( 0 );
    }

    if( (*p) + 2 > end )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );

    /*
     * Get hash algorithm
     */
    if( ( *md_alg = mbedtls_ssl_md_alg_from_hash( (*p)[0] ) ) == MBEDTLS_MD_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "Server used unsupported "
                            "HashAlgorithm %d", *(p)[0] ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    /*
     * Get signature algorithm
     */
    if( ( *pk_alg = mbedtls_ssl_pk_alg_from_sig( (*p)[1] ) ) == MBEDTLS_PK_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "server used unsupported "
                            "SignatureAlgorithm %d", (*p)[1] ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    /*
     * Check if the hash is acceptable
     */
    if( mbedtls_ssl_check_sig_hash( ssl, *md_alg ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "server used HashAlgorithm "
                                    "that was not offered" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "Server used SignatureAlgorithm %d", (*p)[1] ) );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "Server used HashAlgorithm %d", (*p)[0] ) );
    *p += 2;

    return( 0 );
}